

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_1::UnspecifiedAttachmentSizeRboCase::testDepthAttachment
          (UnspecifiedAttachmentSizeRboCase *this)

{
  GLuint local_14;
  UnspecifiedAttachmentSizeRboCase *pUStack_10;
  GLuint renderbufferID;
  UnspecifiedAttachmentSizeRboCase *this_local;
  
  local_14 = 0;
  pUStack_10 = this;
  glu::CallLogWrapper::glGenRenderbuffers
            (&(this->super_UnspecifiedAttachmentSizeCase).super_ApiCase.super_CallLogWrapper,1,
             &local_14);
  glu::CallLogWrapper::glBindRenderbuffer
            (&(this->super_UnspecifiedAttachmentSizeCase).super_ApiCase.super_CallLogWrapper,0x8d41,
             local_14);
  ApiCase::expectError((ApiCase *)this,0);
  glu::CallLogWrapper::glFramebufferRenderbuffer
            (&(this->super_UnspecifiedAttachmentSizeCase).super_ApiCase.super_CallLogWrapper,0x8d40,
             0x8d00,0x8d41,local_14);
  ApiCase::expectError((ApiCase *)this,0);
  checkAttachmentComponentSizeExactly
            ((this->super_UnspecifiedAttachmentSizeCase).super_ApiCase.super_TestCase.super_TestCase
             .super_TestNode.m_testCtx,
             &(this->super_UnspecifiedAttachmentSizeCase).super_ApiCase.super_CallLogWrapper,0x8d40,
             0x8d00,0,0,0,0,0,0);
  ApiCase::expectError((ApiCase *)this,0);
  glu::CallLogWrapper::glFramebufferRenderbuffer
            (&(this->super_UnspecifiedAttachmentSizeCase).super_ApiCase.super_CallLogWrapper,0x8d40,
             0x8d00,0x8d41,0);
  glu::CallLogWrapper::glDeleteRenderbuffers
            (&(this->super_UnspecifiedAttachmentSizeCase).super_ApiCase.super_CallLogWrapper,1,
             &local_14);
  return;
}

Assistant:

void testDepthAttachment (void)
	{
		GLuint renderbufferID = 0;
		glGenRenderbuffers(1, &renderbufferID);
		glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
		expectError(GL_NO_ERROR);

		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, renderbufferID);
		expectError(GL_NO_ERROR);

		checkAttachmentComponentSizeExactly	(m_testCtx, *this, GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, 0, 0, 0, 0, 0, 0);
		expectError(GL_NO_ERROR);

		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, 0);
		glDeleteRenderbuffers(1, &renderbufferID);
	}